

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test60(void)

{
  CMOptions Options;
  undefined1 auVar1 [24];
  reference pvVar2;
  allocator<char> local_2649;
  string local_2648;
  string local_2628;
  allocator<char> local_2601;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25c0;
  _CM_DEBUG_FAILURE_REASON local_25a0;
  allocator<char> local_2599;
  string local_2598;
  string local_2578;
  allocator<char> local_2551;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2510;
  int local_24f0;
  allocator<char> local_24e9;
  string local_24e8;
  string local_24c8;
  allocator<char> local_24a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2460;
  int local_2440;
  allocator<char> local_2439;
  string local_2438;
  string local_2418;
  allocator<char> local_23f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23b0;
  _CM_DEBUG_FAILURE_REASON local_2390;
  allocator<char> local_2389;
  string local_2388;
  string local_2368;
  allocator<char> local_2341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2300;
  int local_22e0;
  allocator<char> local_22d9;
  string local_22d8;
  string local_22b8;
  allocator<char> local_2291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2250;
  int local_2230;
  allocator<char> local_2229;
  string local_2228;
  string local_2208;
  allocator<char> local_21e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21a0;
  size_type local_2180;
  int local_2174;
  CMReturn local_2170;
  pointer local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  allocator<char> local_2121;
  string local_2120;
  allocator<char> local_20f9;
  string local_20f8;
  undefined1 auStack_20d8 [8];
  vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> failures;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2070;
  undefined1 local_2058 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  undefined1 local_20 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2070,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_20b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_20b8._M_h._M_rehash_policy._4_4_ = 0;
  local_20b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_20b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_20b8._M_h._M_element_count = 0;
  local_20b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_20b8._M_h._M_bucket_count = 0;
  local_20b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_20b8);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_2058,&local_2070,&local_20b8,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_20b8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2070);
  auStack_20d8 = (undefined1  [8])0x0;
  failures.super__Vector_base<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  failures.super__Vector_base<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::vector
            ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20f8,"FASD",&local_20f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2120,"ASD",&local_2121);
  local_2138 = 1;
  uStack_2130 = 0;
  local_2148 = 0;
  uStack_2140 = 1000000;
  local_2158 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2150 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options.TimeoutNs = 1000000;
  Options.MatchRepeating = (bool)auVar1[0];
  Options._1_7_ = auVar1._1_7_;
  Options.StartIndex = auVar1._8_8_;
  Options.StartFromEnd = (bool)auVar1[0x10];
  Options._17_7_ = auVar1._17_7_;
  Options._32_8_ = 1;
  Options.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOfDebugFailures
            (&local_2170,(ConfusableMatcher *)local_2058,&local_20f8,&local_2120,Options,
             (vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8);
  std::__cxx11::string::~string((string *)&local_2120);
  std::allocator<char>::~allocator(&local_2121);
  std::__cxx11::string::~string((string *)&local_20f8);
  std::allocator<char>::~allocator(&local_20f9);
  local_2174 = 2;
  local_2180 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::size
                         ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21e0,"Test60",&local_21e1);
  std::operator+(&local_21c0,&local_21e0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2228,"2 == failures.size()",&local_2229);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2208,&local_2228);
  std::operator+(&local_21a0,&local_21c0,&local_2208);
  cute::assert_equal<int,unsigned_long>
            (&local_2174,&local_2180,&local_21a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x5e8);
  std::__cxx11::string::~string((string *)&local_21a0);
  std::__cxx11::string::~string((string *)&local_2208);
  std::__cxx11::string::~string((string *)&local_2228);
  std::allocator<char>::~allocator(&local_2229);
  std::__cxx11::string::~string((string *)&local_21c0);
  std::__cxx11::string::~string((string *)&local_21e0);
  std::allocator<char>::~allocator(&local_21e1);
  local_2230 = 4;
  pvVar2 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2290,"Test60",&local_2291);
  std::operator+(&local_2270,&local_2290,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_22d8,"4 == failures[0].InPos",&local_22d9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_22b8,&local_22d8);
  std::operator+(&local_2250,&local_2270,&local_22b8);
  cute::assert_equal<int,unsigned_long>
            (&local_2230,&pvVar2->InPos,&local_2250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x5ea);
  std::__cxx11::string::~string((string *)&local_2250);
  std::__cxx11::string::~string((string *)&local_22b8);
  std::__cxx11::string::~string((string *)&local_22d8);
  std::allocator<char>::~allocator(&local_22d9);
  std::__cxx11::string::~string((string *)&local_2270);
  std::__cxx11::string::~string((string *)&local_2290);
  std::allocator<char>::~allocator(&local_2291);
  local_22e0 = 3;
  pvVar2 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2340,"Test60",&local_2341);
  std::operator+(&local_2320,&local_2340,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2388,"3 == failures[0].ContainsPos",&local_2389);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2368,&local_2388);
  std::operator+(&local_2300,&local_2320,&local_2368);
  cute::assert_equal<int,unsigned_long>
            (&local_22e0,&pvVar2->ContainsPos,&local_2300,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x5eb);
  std::__cxx11::string::~string((string *)&local_2300);
  std::__cxx11::string::~string((string *)&local_2368);
  std::__cxx11::string::~string((string *)&local_2388);
  std::allocator<char>::~allocator(&local_2389);
  std::__cxx11::string::~string((string *)&local_2320);
  std::__cxx11::string::~string((string *)&local_2340);
  std::allocator<char>::~allocator(&local_2341);
  local_2390 = DEBUG_FAILURE_REASON_WORD_BOUNDARY_FAIL_START;
  pvVar2 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23f0,"Test60",&local_23f1);
  std::operator+(&local_23d0,&local_23f0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2438,
             "DEBUG_FAILURE_REASON_WORD_BOUNDARY_FAIL_START == failures[0].Reason",&local_2439);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2418,&local_2438);
  std::operator+(&local_23b0,&local_23d0,&local_2418);
  cute::assert_equal<_CM_DEBUG_FAILURE_REASON,_CM_DEBUG_FAILURE_REASON>
            (&local_2390,&pvVar2->Reason,&local_23b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x5ec);
  std::__cxx11::string::~string((string *)&local_23b0);
  std::__cxx11::string::~string((string *)&local_2418);
  std::__cxx11::string::~string((string *)&local_2438);
  std::allocator<char>::~allocator(&local_2439);
  std::__cxx11::string::~string((string *)&local_23d0);
  std::__cxx11::string::~string((string *)&local_23f0);
  std::allocator<char>::~allocator(&local_23f1);
  local_2440 = 4;
  pvVar2 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_24a0,"Test60",&local_24a1);
  std::operator+(&local_2480,&local_24a0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24e8,"4 == failures[1].InPos",&local_24e9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_24c8,&local_24e8);
  std::operator+(&local_2460,&local_2480,&local_24c8);
  cute::assert_equal<int,unsigned_long>
            (&local_2440,&pvVar2->InPos,&local_2460,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x5ee);
  std::__cxx11::string::~string((string *)&local_2460);
  std::__cxx11::string::~string((string *)&local_24c8);
  std::__cxx11::string::~string((string *)&local_24e8);
  std::allocator<char>::~allocator(&local_24e9);
  std::__cxx11::string::~string((string *)&local_2480);
  std::__cxx11::string::~string((string *)&local_24a0);
  std::allocator<char>::~allocator(&local_24a1);
  local_24f0 = 0;
  pvVar2 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2550,"Test60",&local_2551);
  std::operator+(&local_2530,&local_2550,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2598,"0 == failures[1].ContainsPos",&local_2599);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2578,&local_2598);
  std::operator+(&local_2510,&local_2530,&local_2578);
  cute::assert_equal<int,unsigned_long>
            (&local_24f0,&pvVar2->ContainsPos,&local_2510,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x5ef);
  std::__cxx11::string::~string((string *)&local_2510);
  std::__cxx11::string::~string((string *)&local_2578);
  std::__cxx11::string::~string((string *)&local_2598);
  std::allocator<char>::~allocator(&local_2599);
  std::__cxx11::string::~string((string *)&local_2530);
  std::__cxx11::string::~string((string *)&local_2550);
  std::allocator<char>::~allocator(&local_2551);
  local_25a0 = DEBUG_FAILURE_REASON_NO_PATH;
  pvVar2 = std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::operator[]
                     ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2600,"Test60",&local_2601);
  std::operator+(&local_25e0,&local_2600,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2648,"DEBUG_FAILURE_REASON_NO_PATH == failures[1].Reason",&local_2649)
  ;
  cute::cute_to_string::backslashQuoteTabNewline(&local_2628,&local_2648);
  std::operator+(&local_25c0,&local_25e0,&local_2628);
  cute::assert_equal<_CM_DEBUG_FAILURE_REASON,_CM_DEBUG_FAILURE_REASON>
            (&local_25a0,&pvVar2->Reason,&local_25c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x5f0);
  std::__cxx11::string::~string((string *)&local_25c0);
  std::__cxx11::string::~string((string *)&local_2628);
  std::__cxx11::string::~string((string *)&local_2648);
  std::allocator<char>::~allocator(&local_2649);
  std::__cxx11::string::~string((string *)&local_25e0);
  std::__cxx11::string::~string((string *)&local_2600);
  std::allocator<char>::~allocator(&local_2601);
  std::vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_>::~vector
            ((vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)auStack_20d8);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_2058);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_20);
  return;
}

Assistant:

void Test60()
{
	std::vector<std::pair<std::string, std::string>> map;

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchOnWordBoundary = true;
	opts.MatchRepeating = false;
	opts.StartIndex = 0;

	auto matcher = ConfusableMatcher(map, { });
	auto failures = std::vector<CMDebugFailure>();

	matcher.IndexOfDebugFailures("FASD", "ASD", opts, &failures);

	ASSERT_EQUAL(2, failures.size());

	ASSERT_EQUAL(4, failures[0].InPos);
	ASSERT_EQUAL(3, failures[0].ContainsPos);
	ASSERT_EQUAL(DEBUG_FAILURE_REASON_WORD_BOUNDARY_FAIL_START, failures[0].Reason);

	ASSERT_EQUAL(4, failures[1].InPos);
	ASSERT_EQUAL(0, failures[1].ContainsPos);
	ASSERT_EQUAL(DEBUG_FAILURE_REASON_NO_PATH, failures[1].Reason);
}